

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

bool boost::ext::ut::v1_1_8::detail::on<bool,boost::ext::ut::v1_1_8::events::assertion<bool>>
               (assertion<bool> *event)

{
  undefined8 uVar1;
  assertion_fail<bool> assertion;
  bool bVar2;
  undefined1 uStack_31;
  undefined7 uStack_30;
  undefined4 uStack_29;
  undefined7 uStack_17;
  undefined4 uStack_4;
  
  bVar2 = true;
  uVar1 = *(undefined8 *)((long)&(event->location).file_ + 1);
  uStack_31 = (undefined1)((ulong)*(undefined8 *)&event->field_0x1 >> 0x38);
  uStack_30 = (undefined7)uVar1;
  uStack_29._1_3_ = (undefined3)((uint)(event->location).line_ >> 8);
  uStack_29._0_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  if (cfg<boost::ext::ut::v1_1_8::override>[0x348] == '\0') {
    if ((event->expr & 1U) == 0) {
      assertion.location.file_._1_7_ = uStack_30;
      assertion.location.file_._0_1_ = uStack_31;
      cfg<boost::ext::ut::v1_1_8::override>._528_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._528_8_ + 1;
      assertion.location._12_4_ = uStack_4;
      assertion.location.line_ = uStack_29;
      assertion._1_7_ = uStack_17;
      assertion.expr = event->expr;
      reporter<boost::ext::ut::v1_1_8::printer>::on<bool>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)cfg<boost::ext::ut::v1_1_8::override>,
                 assertion);
      bVar2 = false;
    }
    else {
      cfg<boost::ext::ut::v1_1_8::override>._24_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._24_8_ + 1;
    }
  }
  return bVar2;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}